

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O2

string * __thiscall
bf_crc::feed_type_to_str_abi_cxx11_(string *__return_storage_ptr__,bf_crc *this,FEED_TYPE feed_type)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(feed_type) {
  case AUTO:
    __s = "auto";
    __a = &local_9;
    break;
  case LINEAR_FORWARD:
    __s = "linear-forward";
    __a = &local_a;
    break;
  case LINEAR_REVERSED:
    __s = "linear-reversed";
    __a = &local_b;
    break;
  case BYTEWISE_REVERSED:
    __s = "bytewise-reversed";
    __a = &local_c;
    break;
  default:
    __s = "undefined";
    __a = &local_d;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string bf_crc::feed_type_to_str(my_crc_basic::FEED_TYPE feed_type) { 
  switch(feed_type) {
  case my_crc_basic::AUTO: return "auto";
  case my_crc_basic::LINEAR_FORWARD: return "linear-forward";
  case my_crc_basic::LINEAR_REVERSED: return "linear-reversed";
  case my_crc_basic::BYTEWISE_REVERSED: return "bytewise-reversed";
  default: return "undefined";
  }
}